

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSwapBuffersTests.cpp
# Opt level: O3

void __thiscall
deqp::egl::anon_unknown_4::SwapBuffersTest::executeForConfig
          (SwapBuffersTest *this,EGLDisplay display,EGLConfig config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TestLog *pTVar2;
  NativeWindow *pNVar3;
  size_type sVar4;
  bool bVar5;
  deUint32 dVar6;
  EGLint EVar7;
  int iVar8;
  GLuint GVar9;
  GLuint GVar10;
  GLuint GVar11;
  GLenum GVar12;
  Library *egl;
  NativeWindowFactory *pNVar13;
  undefined4 extraout_var;
  EGLSurface surface_00;
  undefined4 extraout_var_00;
  pointer __dest;
  NotSupportedError *this_00;
  TestError *pTVar14;
  SwapBuffersTest *pSVar15;
  deInt32 fragmentCompileStatus;
  deInt32 vertexCompileStatus;
  deInt32 linkStatus;
  deInt32 infoLogLength;
  size_type __dnew;
  string fragmentInfoLog;
  ScopedLogSection logSection;
  string programInfoLog;
  string vertexInfoLog;
  UniqueSurface surface;
  char *fragmentShaderSource;
  char *vertexShaderSource;
  string configIdStr;
  UniqueContext context;
  TextureLevel blackFrame;
  TextureLevel whiteFrame;
  TextureLevel frameEnd;
  TextureLevel frameBegin;
  Functions gl;
  int local_1cd4;
  int local_1cd0;
  int local_1ccc;
  undefined1 local_1cc8 [8];
  _Alloc_hider _Stack_1cc0;
  undefined1 local_1cb8 [24];
  bool local_1ca0;
  _Alloc_hider local_1c98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c88;
  TestLog *local_1c70;
  NativeWindow *local_1c68;
  string local_1c60;
  size_type local_1c40;
  string local_1c38;
  SwapBuffersTest *local_1c18;
  ScopedLogSection local_1c10;
  GLchar *local_1c08;
  undefined8 local_1c00;
  GLchar local_1bf8;
  undefined7 uStack_1bf7;
  undefined1 local_1be8 [40];
  UniqueSurface local_1bc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1ba8;
  undefined8 local_1b88;
  undefined8 uStack_1b80;
  string local_1b78;
  undefined8 local_1b58;
  undefined8 uStack_1b50;
  char *local_1b40;
  char *local_1b38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b30;
  UniqueContext local_1b10;
  TextureLevel local_1af8;
  TextureLevel local_1ad0;
  TextureLevel local_1aa8;
  TextureLevel local_1a80;
  undefined1 local_1a58 [8];
  undefined4 local_1a50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a48 [6];
  ios_base local_19e8 [8];
  ios_base local_19e0 [272];
  glClearFunc local_18d0;
  glClearColorFunc local_1898;
  glCompileShaderFunc local_1810;
  glCreateProgramFunc local_1690;
  glCreateShaderFunc local_1668;
  glDeleteProgramFunc local_1610;
  glDeleteShaderFunc local_15e8;
  glDisableVertexAttribArrayFunc local_1540;
  glDrawArraysFunc local_1520;
  glEnableVertexAttribArrayFunc local_1448;
  glFinishFunc local_1410;
  glGetAttribLocationFunc local_12d8;
  glGetErrorFunc local_1258;
  glGetProgramInfoLogFunc local_10d0;
  glGetProgramivFunc local_1080;
  glGetShaderInfoLogFunc local_1000;
  glGetShaderivFunc local_fe8;
  glLinkProgramFunc local_d70;
  glShaderSourceFunc local_7a0;
  glUseProgramFunc local_3d8;
  glVertexAttribPointerFunc local_68;
  
  egl = EglTestContext::getLibrary((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a58);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x3028);
  dVar6 = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(dVar6,"getConfigAttrib(display, config , EGL_CONFIG_ID, &id)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                   ,0x72);
  std::ostream::operator<<(local_1a58,local_1cc8._0_4_);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a58);
  std::ios_base::~ios_base(local_19e8);
  pTVar2 = ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
           m_log;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1cc8,
                 "Config ID ",&local_1b30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1a58,(char *)local_1cc8,(allocator<char> *)&local_1ad0);
  std::operator+(&local_1ba8,"Config ID ",&local_1b30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b78,local_1ba8._M_dataplus._M_p,(allocator<char> *)&local_1af8);
  tcu::ScopedLogSection::ScopedLogSection(&local_1c10,pTVar2,(string *)local_1a58,&local_1b78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b78._M_dataplus._M_p != &local_1b78.field_2) {
    operator_delete(local_1b78._M_dataplus._M_p,
                    CONCAT44(local_1b78.field_2._M_allocated_capacity._4_4_,
                             local_1b78.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1ba8._M_dataplus._M_p != &local_1ba8.field_2) {
    operator_delete(local_1ba8._M_dataplus._M_p,local_1ba8.field_2._M_allocated_capacity + 1);
  }
  if (local_1a58 != (undefined1  [8])local_1a48) {
    operator_delete((void *)local_1a58,(ulong)(local_1a48[0]._M_allocated_capacity + 1));
  }
  if (local_1cc8 != (undefined1  [8])local_1cb8) {
    operator_delete((void *)local_1cc8,local_1cb8._0_8_ + 1);
  }
  pNVar13 = eglu::selectNativeWindowFactory
                      (((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx)->
                       m_nativeDisplayFactory,
                       ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                       m_testCtx)->m_cmdLine);
  if ((pNVar13->m_capabilities & CAPABILITY_READ_SCREEN_PIXELS) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"eglu::NativeWindow doesn\'t support readScreenPixels()",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
               ,0x114);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  pTVar2 = ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
           m_log;
  local_1c18 = this;
  local_1a58 = (undefined1  [8])pTVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a50);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a50,"EGL_RED_SIZE: ",0xe);
  EVar7 = eglu::getConfigAttribInt(egl,display,config,0x3024);
  std::ostream::operator<<((ostringstream *)&local_1a50,EVar7);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a58,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a50);
  std::ios_base::~ios_base(local_19e0);
  local_1a58 = (undefined1  [8])pTVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a50);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a50,"EGL_GREEN_SIZE: ",0x10)
  ;
  EVar7 = eglu::getConfigAttribInt(egl,display,config,0x3023);
  std::ostream::operator<<((ostringstream *)&local_1a50,EVar7);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a58,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a50);
  std::ios_base::~ios_base(local_19e0);
  local_1a58 = (undefined1  [8])pTVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a50);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a50,"EGL_BLUE_SIZE: ",0xf);
  EVar7 = eglu::getConfigAttribInt(egl,display,config,0x3022);
  std::ostream::operator<<((ostringstream *)&local_1a50,EVar7);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a58,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a50);
  std::ios_base::~ios_base(local_19e0);
  local_1a58 = (undefined1  [8])pTVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a50);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a50,"EGL_ALPHA_SIZE: ",0x10)
  ;
  EVar7 = eglu::getConfigAttribInt(egl,display,config,0x3021);
  std::ostream::operator<<((ostringstream *)&local_1a50,EVar7);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a58,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a50);
  std::ios_base::~ios_base(local_19e0);
  local_1a58 = (undefined1  [8])pTVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a50);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a50,"EGL_DEPTH_SIZE: ",0x10)
  ;
  EVar7 = eglu::getConfigAttribInt(egl,display,config,0x3025);
  std::ostream::operator<<((ostringstream *)&local_1a50,EVar7);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a58,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a50);
  std::ios_base::~ios_base(local_19e0);
  local_1a58 = (undefined1  [8])pTVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a50);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a50,"EGL_STENCIL_SIZE: ",0x12);
  EVar7 = eglu::getConfigAttribInt(egl,display,config,0x3026);
  std::ostream::operator<<((ostringstream *)&local_1a50,EVar7);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a58,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a50);
  std::ios_base::~ios_base(local_19e0);
  local_1a58 = (undefined1  [8])pTVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a50);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a50,"EGL_SAMPLES: ",0xd);
  EVar7 = eglu::getConfigAttribInt(egl,display,config,0x3031);
  std::ostream::operator<<((ostringstream *)&local_1a50,EVar7);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a58,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a50);
  std::ios_base::~ios_base(local_19e0);
  local_1a58 = (undefined1  [8])pTVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a50);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a50,"Waiting ",8);
  std::ostream::operator<<((ostringstream *)&local_1a50,0x50);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a50,
             "ms after eglSwapBuffers() and glFinish() for frame to become visible",0x44);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a58,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a50);
  std::ios_base::~ios_base(local_19e0);
  pSVar15 = local_1c18;
  local_1a58 = (undefined1  [8])0x8000000080;
  local_1a50 = 1;
  iVar8 = (*(pNVar13->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[4])
                    (pNVar13,(((local_1c18->super_SimpleConfigCase).super_TestCase.m_eglTestCtx)->
                             m_nativeDisplay).
                             super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                             .m_data.ptr,display,config,0,local_1a58);
  local_1c68 = (NativeWindow *)CONCAT44(extraout_var,iVar8);
  surface_00 = eglu::createWindowSurface
                         ((((pSVar15->super_SimpleConfigCase).super_TestCase.m_eglTestCtx)->
                          m_nativeDisplay).
                          super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>
                          .m_data.ptr,local_1c68,display,config,(EGLAttrib *)0x0);
  eglu::UniqueSurface::UniqueSurface(&local_1bc0,egl,display,surface_00);
  local_1a58 = (undefined1  [8])0x200003098;
  local_1a50 = 0x3038;
  (**egl->_vptr_Library)(egl,0x30a0);
  dVar6 = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(dVar6,"bindAPI(EGL_OPENGL_ES_API)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                   ,0x4c);
  iVar8 = (*egl->_vptr_Library[6])(egl,display,config,0,local_1a58);
  dVar6 = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(dVar6,"eglCreateContext() failed",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                   ,0x4f);
  if ((EGLContext)CONCAT44(extraout_var_00,iVar8) == (EGLContext)0x0) {
    pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar14,(char *)0x0,"context",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
               ,0x50);
    __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  eglu::UniqueContext::UniqueContext
            (&local_1b10,egl,display,(EGLContext)CONCAT44(extraout_var_00,iVar8));
  glw::Functions::Functions((Functions *)local_1a58);
  tcu::TextureLevel::TextureLevel(&local_1ad0);
  tcu::TextureLevel::TextureLevel(&local_1af8);
  tcu::TextureLevel::TextureLevel(&local_1a80);
  tcu::TextureLevel::TextureLevel(&local_1aa8);
  EglTestContext::initGLFunctions
            ((pSVar15->super_SimpleConfigCase).super_TestCase.m_eglTestCtx,(Functions *)local_1a58,
             (ApiType)0x2);
  (*egl->_vptr_Library[0x27])(egl,display,local_1bc0.m_surface);
  dVar6 = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(dVar6,"makeCurrent(display, *surface, *surface, *context)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                   ,0x131);
  local_1b78._M_dataplus._M_p = (pointer)0x0;
  uStack_1b50 = 0;
  local_1b78._M_string_length = 0x3f400000;
  local_1b78.field_2._M_allocated_capacity._0_4_ = 0x3f400000;
  local_1b78.field_2._M_allocated_capacity._4_4_ = 0x3f400000;
  local_1b78.field_2._8_4_ = 0x3f400000;
  local_1b78.field_2._12_4_ = 0x3f400000;
  local_1b58 = 0x3f40000000000000;
  local_1ba8.field_2._M_allocated_capacity = 0;
  local_1ba8.field_2._8_8_ = 0;
  local_1ba8._M_dataplus._M_p = (pointer)0xbf400000bf400000;
  local_1ba8._M_string_length = 0xbf40000000000000;
  local_1b88 = 0xbf400000;
  uStack_1b80 = 0xbf400000bf400000;
  pTVar2 = ((pSVar15->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
           )->m_log;
  local_1b38 = 
  "attribute highp vec2 a_pos;\nvoid main (void)\n{\n\tgl_Position = vec4(a_pos, 0.0, 1.0);\n}";
  local_1b40 = "void main (void)\n{\n\tgl_FragColor = vec4(0.9, 0.1, 0.4, 1.0);\n}";
  local_1be8._0_8_ = (long)local_1be8 + 0x10;
  local_1be8._8_8_ = 0;
  local_1be8[0x10] = '\0';
  local_1c38._M_dataplus._M_p = (pointer)&local_1c38.field_2;
  local_1c38._M_string_length = 0;
  local_1c38.field_2._M_local_buf[0] = '\0';
  local_1c08 = &local_1bf8;
  local_1c00 = 0;
  local_1bf8 = '\0';
  GVar9 = (*local_1690)();
  GVar10 = (*local_1668)(0x8b31);
  GVar11 = (*local_1668)(0x8b30);
  GVar12 = (*local_1258)();
  glu::checkError(GVar12,"Failed to create shaders and program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                  ,0x99);
  (*local_7a0)(GVar10,1,&local_1b38,(GLint *)0x0);
  (*local_1810)(GVar10);
  GVar12 = (*local_1258)();
  glu::checkError(GVar12,"Failed to setup vertex shader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                  ,0x9d);
  (*local_7a0)(GVar11,1,&local_1b40,(GLint *)0x0);
  (*local_1810)(GVar11);
  GVar12 = (*local_1258)();
  glu::checkError(GVar12,"Failed to setup fragment shader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                  ,0xa1);
  local_1cc8._0_4_ = 0.0;
  (*local_fe8)(GVar10,0x8b81,&local_1cd0);
  (*local_fe8)(GVar10,0x8b84,(GLint *)local_1cc8);
  std::__cxx11::string::resize((ulong)local_1be8,(char)local_1cc8._0_4_);
  (*local_1000)(GVar10,local_1be8._8_4_,(GLsizei *)local_1cc8,(GLchar *)local_1be8._0_8_);
  GVar12 = (*local_1258)();
  glu::checkError(GVar12,"Failed to get vertex shader compile info",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                  ,0xac);
  std::__cxx11::string::resize((ulong)local_1be8,(char)local_1cc8._0_4_);
  local_1cc8._0_4_ = 0.0;
  (*local_fe8)(GVar11,0x8b81,&local_1cd4);
  (*local_fe8)(GVar11,0x8b84,(GLint *)local_1cc8);
  std::__cxx11::string::resize((ulong)&local_1c38,(char)local_1cc8._0_4_);
  (*local_1000)(GVar11,(GLsizei)local_1c38._M_string_length,(GLsizei *)local_1cc8,
                local_1c38._M_dataplus._M_p);
  GVar12 = (*local_1258)();
  glu::checkError(GVar12,"Failed to get fragment shader compile info",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                  ,0xba);
  std::__cxx11::string::resize((ulong)&local_1c38,(char)local_1cc8._0_4_);
  (*(code *)local_1a48[0]._0_8_)(GVar9,GVar10);
  (*(code *)local_1a48[0]._0_8_)(GVar9,GVar11);
  (*local_d70)(GVar9);
  GVar12 = (*local_1258)();
  glu::checkError(GVar12,"Failed to setup program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                  ,0xc2);
  local_1cc8 = (undefined1  [8])((ulong)(uint)local_1cc8._4_4_ << 0x20);
  (*local_1080)(GVar9,0x8b82,&local_1ccc);
  (*local_1080)(GVar9,0x8b84,(GLint *)local_1cc8);
  std::__cxx11::string::resize((ulong)&local_1c08,local_1cc8[0]);
  (*local_10d0)(GVar9,(GLsizei)local_1c00,(GLsizei *)local_1cc8,local_1c08);
  GVar12 = (*local_1258)();
  glu::checkError(GVar12,"Failed to get program link info",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                  ,0xcd);
  std::__cxx11::string::resize((ulong)&local_1c08,local_1cc8[0]);
  if (((local_1ccc == 0) || (local_1cd0 == 0)) || (local_1cd4 == 0)) {
    tcu::TestLog::startShaderProgram(pTVar2,local_1ccc != 0,local_1c08);
    local_1c60._M_dataplus._M_p = (pointer)&local_1c60.field_2;
    local_1c40 = 0x56;
    local_1c70 = pTVar2;
    __dest = (pointer)std::__cxx11::string::_M_create((ulong *)&local_1c60,(ulong)&local_1c40);
    sVar4 = local_1c40;
    local_1c60.field_2._M_allocated_capacity = local_1c40;
    local_1c60._M_dataplus._M_p = __dest;
    memcpy(__dest,
           "attribute highp vec2 a_pos;\nvoid main (void)\n{\n\tgl_Position = vec4(a_pos, 0.0, 1.0);\n}"
           ,0x56);
    local_1c60._M_string_length = sVar4;
    __dest[sVar4] = '\0';
    tcu::LogShader::LogShader
              ((LogShader *)local_1cc8,QP_SHADER_TYPE_VERTEX,&local_1c60,local_1cd0 != 0,
               (string *)local_1be8);
    tcu::TestLog::writeShader
              (local_1c70,local_1cc8._0_4_,_Stack_1cc0._M_p,local_1ca0,local_1c98._M_p);
    paVar1 = &local_1c60.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c98._M_p != &local_1c88) {
      operator_delete(local_1c98._M_p,local_1c88._M_allocated_capacity + 1);
    }
    if (_Stack_1cc0._M_p != local_1cb8 + 8) {
      operator_delete(_Stack_1cc0._M_p,local_1cb8._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c60._M_dataplus._M_p != paVar1) {
      operator_delete(local_1c60._M_dataplus._M_p,local_1c60.field_2._M_allocated_capacity + 1);
    }
    local_1c40 = 0x3e;
    local_1c60._M_dataplus._M_p = (pointer)paVar1;
    local_1c60._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_1c60,(ulong)&local_1c40);
    local_1c60.field_2._M_allocated_capacity = local_1c40;
    builtin_strncpy(local_1c60._M_dataplus._M_p,
                    "void main (void)\n{\n\tgl_FragColor = vec4(0.9, 0.1, 0.4, 1.0);\n}",0x3e);
    local_1c60._M_string_length = local_1c40;
    local_1c60._M_dataplus._M_p[local_1c40] = '\0';
    tcu::LogShader::LogShader
              ((LogShader *)local_1cc8,QP_SHADER_TYPE_FRAGMENT,&local_1c60,local_1cd4 != 0,
               &local_1c38);
    tcu::TestLog::writeShader
              (local_1c70,local_1cc8._0_4_,_Stack_1cc0._M_p,local_1ca0,local_1c98._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c98._M_p != &local_1c88) {
      operator_delete(local_1c98._M_p,local_1c88._M_allocated_capacity + 1);
    }
    pTVar2 = local_1c70;
    if (_Stack_1cc0._M_p != local_1cb8 + 8) {
      operator_delete(_Stack_1cc0._M_p,local_1cb8._8_8_ + 1);
    }
    pSVar15 = local_1c18;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c60._M_dataplus._M_p != paVar1) {
      operator_delete(local_1c60._M_dataplus._M_p,local_1c60.field_2._M_allocated_capacity + 1);
    }
    tcu::TestLog::endShaderProgram(pTVar2);
  }
  (*local_15e8)(GVar10);
  (*local_15e8)(GVar11);
  GVar12 = (*local_1258)();
  glu::checkError(GVar12,"Failed to delete shaders",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                  ,0xdf);
  if (((local_1ccc == 0) || (local_1cd0 == 0)) || (local_1cd4 == 0)) {
    pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar14,(char *)0x0,
               "linkStatus != 0 && vertexCompileStatus != 0 && fragmentCompileStatus != 0",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
               ,0xe1);
    __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  if (local_1c08 != &local_1bf8) {
    operator_delete(local_1c08,CONCAT71(uStack_1bf7,local_1bf8) + 1);
  }
  pNVar3 = local_1c68;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c38._M_dataplus._M_p != &local_1c38.field_2) {
    operator_delete(local_1c38._M_dataplus._M_p,
                    CONCAT71(local_1c38.field_2._M_allocated_capacity._1_7_,
                             local_1c38.field_2._M_local_buf[0]) + 1);
  }
  if (local_1be8._0_8_ != (long)local_1be8 + 0x10) {
    operator_delete((void *)local_1be8._0_8_,CONCAT71(local_1be8._17_7_,local_1be8[0x10]) + 1);
  }
  (*local_3d8)(GVar9);
  GVar10 = (*local_12d8)(GVar9,"a_pos");
  (*local_1448)(GVar10);
  GVar12 = (*local_1258)();
  glu::checkError(GVar12,"Failed to setup shader program for rendering",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                  ,0x150);
  (*local_1898)(1.0,1.0,1.0,1.0);
  (*local_18d0)(0x4000);
  GVar12 = (*local_1258)();
  glu::checkError(GVar12,"Failed to clear surface",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                  ,0x155);
  (*egl->_vptr_Library[0x31])(egl,display,local_1bc0.m_surface);
  dVar6 = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(dVar6,"swapBuffers(display, *surface)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                   ,0x157);
  (*local_1410)();
  GVar12 = (*local_1258)();
  glu::checkError(GVar12,"glFinish() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                  ,0x159);
  deSleep(0x50);
  (*pNVar3->_vptr_NativeWindow[4])(pNVar3);
  (*pNVar3->_vptr_NativeWindow[8])(pNVar3,&local_1ad0);
  local_1cc8._0_4_ = 0x3f800000;
  local_1cc8._4_4_ = 0x3f800000;
  _Stack_1cc0._M_p = (pointer)0x3f8000003f800000;
  bVar5 = checkColor(((pSVar15->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode
                     .m_testCtx)->m_log,&local_1ad0,(Vec4 *)local_1cc8);
  if (bVar5) {
    (*local_1898)(0.0,0.0,0.0,1.0);
    (*local_18d0)(0x4000);
    GVar12 = (*local_1258)();
    glu::checkError(GVar12,"Failed to clear surface",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                    ,0x167);
    (*egl->_vptr_Library[0x31])(egl,display,local_1bc0.m_surface);
    dVar6 = (*egl->_vptr_Library[0x1f])(egl);
    eglu::checkError(dVar6,"swapBuffers(display, *surface)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                     ,0x169);
    (*local_1410)();
    GVar12 = (*local_1258)();
    glu::checkError(GVar12,"glFinish() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                    ,0x16b);
    deSleep(0x50);
    (*pNVar3->_vptr_NativeWindow[4])(pNVar3);
    (*pNVar3->_vptr_NativeWindow[8])(pNVar3,&local_1af8);
    local_1cc8._0_4_ = R;
    local_1cc8._4_4_ = SNORM_INT8;
    _Stack_1cc0._M_p = (pointer)0x3f80000000000000;
    bVar5 = checkColor(((pSVar15->super_SimpleConfigCase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx)->m_log,&local_1af8,(Vec4 *)local_1cc8);
    if (bVar5) {
      (*local_1898)(0.7,1.0,0.3,1.0);
      (*local_18d0)(0x4000);
      GVar12 = (*local_1258)();
      glu::checkError(GVar12,"Failed to clear surface",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                      ,0x178);
      (*local_68)(GVar10,2,0x1406,'\0',0,&local_1b78);
      (*local_1520)(4,0,6);
      GVar12 = (*local_1258)();
      glu::checkError(GVar12,"Failed to render",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                      ,0x17c);
      (*egl->_vptr_Library[0x31])(egl,display,local_1bc0.m_surface);
      dVar6 = (*egl->_vptr_Library[0x1f])(egl);
      eglu::checkError(dVar6,"swapBuffers(display, *surface)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                       ,0x17e);
      (*local_1410)();
      GVar12 = (*local_1258)();
      glu::checkError(GVar12,"glFinish() failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                      ,0x180);
      deSleep(0x50);
      (*pNVar3->_vptr_NativeWindow[4])(pNVar3);
      (*pNVar3->_vptr_NativeWindow[8])(pNVar3,&local_1a80);
      (*local_1898)(0.7,0.7,1.0,1.0);
      (*local_18d0)(0x4000);
      GVar12 = (*local_1258)();
      glu::checkError(GVar12,"Failed to clear surface",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                      ,0x187);
      (*local_68)(GVar10,2,0x1406,'\0',0,&local_1ba8);
      (*local_1520)(4,0,6);
      GVar12 = (*local_1258)();
      glu::checkError(GVar12,"Failed to render",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                      ,0x18b);
      (*local_1410)();
      GVar12 = (*local_1258)();
      glu::checkError(GVar12,"glFinish() failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                      ,0x18e);
      deSleep(0x50);
      (*pNVar3->_vptr_NativeWindow[8])(pNVar3,&local_1aa8);
      (*egl->_vptr_Library[0x31])(egl,display,local_1bc0.m_surface);
      dVar6 = (*egl->_vptr_Library[0x1f])(egl);
      eglu::checkError(dVar6,"swapBuffers(display, *surface)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                       ,0x192);
      (*local_1410)();
      GVar12 = (*local_1258)();
      glu::checkError(GVar12,"glFinish() failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                      ,0x194);
      deSleep(0x50);
      (*pNVar3->_vptr_NativeWindow[4])(pNVar3);
      (*local_1540)(GVar10);
      (*local_3d8)(0);
      GVar12 = (*local_1258)();
      glu::checkError(GVar12,"Failed to release program state",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                      ,0x19a);
      (*local_1610)(GVar9);
      GVar12 = (*local_1258)();
      glu::checkError(GVar12,"glDeleteProgram()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                      ,0x19e);
      pTVar2 = ((pSVar15->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx)->m_log;
      tcu::TextureLevel::getAccess((PixelBufferAccess *)local_1cc8,&local_1a80);
      tcu::TextureLevel::getAccess((PixelBufferAccess *)local_1be8,&local_1aa8);
      local_1c38._M_dataplus._M_p = (pointer)0x0;
      local_1c38._M_string_length = 0;
      bVar5 = tcu::intThresholdCompare
                        (pTVar2,"Compare end of frame against beginning of frame",
                         "Compare end of frame against beginning of frame",
                         (ConstPixelBufferAccess *)local_1cc8,(ConstPixelBufferAccess *)local_1be8,
                         (UVec4 *)&local_1c38,COMPARE_LOG_RESULT);
      if (!bVar5) {
        tcu::TestContext::setTestResult
                  ((pSVar15->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                   m_testCtx,QP_TEST_RESULT_FAIL,"Screen pixels changed during frame");
      }
      (*egl->_vptr_Library[0x27])(egl,display,0,0,0);
      dVar6 = (*egl->_vptr_Library[0x1f])(egl);
      eglu::checkError(dVar6,"makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersTests.cpp"
                       ,0x1ac);
      goto LAB_00e2a732;
    }
  }
  tcu::TestContext::setTestResult
            ((pSVar15->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx,QP_TEST_RESULT_FAIL,"Couldn\'t reliably read pixels from screen");
LAB_00e2a732:
  tcu::TextureLevel::~TextureLevel(&local_1aa8);
  tcu::TextureLevel::~TextureLevel(&local_1a80);
  tcu::TextureLevel::~TextureLevel(&local_1af8);
  tcu::TextureLevel::~TextureLevel(&local_1ad0);
  eglu::UniqueContext::~UniqueContext(&local_1b10);
  eglu::UniqueSurface::~UniqueSurface(&local_1bc0);
  (*pNVar3->_vptr_NativeWindow[1])(pNVar3);
  tcu::TestLog::endSection(local_1c10.m_log);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b30._M_dataplus._M_p != &local_1b30.field_2) {
    operator_delete(local_1b30._M_dataplus._M_p,local_1b30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void SwapBuffersTest::executeForConfig (EGLDisplay display, EGLConfig config)
{
	const Library&						egl			= m_eglTestCtx.getLibrary();
	const string						configIdStr	(getConfigIdString(egl, display, config));
	tcu::ScopedLogSection				logSection	(m_testCtx.getLog(), ("Config ID " + configIdStr).c_str(), ("Config ID " + configIdStr).c_str());
	const int							waitFrames	= 5;
	const eglu::NativeWindowFactory&	factory		= eglu::selectNativeWindowFactory(m_eglTestCtx.getNativeDisplayFactory(), m_testCtx.getCommandLine());

	if ((factory.getCapabilities() & eglu::NativeWindow::CAPABILITY_READ_SCREEN_PIXELS) == 0)
		TCU_THROW(NotSupportedError, "eglu::NativeWindow doesn't support readScreenPixels()");

	{
		TestLog& log = m_testCtx.getLog();

		log << TestLog::Message << "EGL_RED_SIZE: "		<< eglu::getConfigAttribInt(egl, display, config, EGL_RED_SIZE)		<< TestLog::EndMessage;
		log << TestLog::Message << "EGL_GREEN_SIZE: "	<< eglu::getConfigAttribInt(egl, display, config, EGL_GREEN_SIZE)	<< TestLog::EndMessage;
		log << TestLog::Message << "EGL_BLUE_SIZE: "	<< eglu::getConfigAttribInt(egl, display, config, EGL_BLUE_SIZE)	<< TestLog::EndMessage;
		log << TestLog::Message << "EGL_ALPHA_SIZE: "	<< eglu::getConfigAttribInt(egl, display, config, EGL_ALPHA_SIZE)	<< TestLog::EndMessage;
		log << TestLog::Message << "EGL_DEPTH_SIZE: "	<< eglu::getConfigAttribInt(egl, display, config, EGL_DEPTH_SIZE)	<< TestLog::EndMessage;
		log << TestLog::Message << "EGL_STENCIL_SIZE: "	<< eglu::getConfigAttribInt(egl, display, config, EGL_STENCIL_SIZE)	<< TestLog::EndMessage;
		log << TestLog::Message << "EGL_SAMPLES: "		<< eglu::getConfigAttribInt(egl, display, config, EGL_SAMPLES)		<< TestLog::EndMessage;

		log << TestLog::Message << "Waiting " << waitFrames * 16 << "ms after eglSwapBuffers() and glFinish() for frame to become visible" << TestLog::EndMessage;
	}

	de::UniquePtr<eglu::NativeWindow>	window	(factory.createWindow(&m_eglTestCtx.getNativeDisplay(), display, config, DE_NULL, eglu::WindowParams(128, 128, eglu::WindowParams::VISIBILITY_VISIBLE)));

	eglu::UniqueSurface					surface	(egl, display, eglu::createWindowSurface(m_eglTestCtx.getNativeDisplay(), *window, display, config, DE_NULL));
	eglu::UniqueContext					context	(egl, display, createGLES2Context(egl, display, config));
	glw::Functions						gl;
	deUint32							program = 0;

	tcu::TextureLevel					whiteFrame;
	tcu::TextureLevel					blackFrame;
	tcu::TextureLevel					frameBegin;
	tcu::TextureLevel					frameEnd;

	m_eglTestCtx.initGLFunctions(&gl, glu::ApiType::es(2,0));
	EGLU_CHECK_CALL(egl, makeCurrent(display, *surface, *surface, *context));

	try
	{
		const float positions1[] = {
			 0.00f,  0.00f,
			 0.75f,  0.00f,
			 0.75f,  0.75f,

			 0.75f,  0.75f,
			 0.00f,  0.75f,
			 0.00f,  0.00f
		};

		const float positions2[] = {
			-0.75f, -0.75f,
			 0.00f, -0.75f,
			 0.00f,  0.00f,

			 0.00f,  0.00f,
			-0.75f,  0.00f,
			-0.75f, -0.75f
		};

		deUint32 posLocation;

		program	= createGLES2Program(gl, m_testCtx.getLog());

		gl.useProgram(program);
		posLocation	= gl.getAttribLocation(program, "a_pos");
		gl.enableVertexAttribArray(posLocation);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to setup shader program for rendering");

		// Clear screen to white and check that sceen is white
		gl.clearColor(1.0f, 1.0f, 1.0f, 1.0f);
		gl.clear(GL_COLOR_BUFFER_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to clear surface");

		EGLU_CHECK_CALL(egl, swapBuffers(display, *surface));
		gl.finish();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glFinish() failed");
		deSleep(waitFrames * 16);
		window->processEvents();
		window->readScreenPixels(&whiteFrame);

		if (!checkColor(m_testCtx.getLog(), whiteFrame, tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f)))
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Couldn't reliably read pixels from screen");
			return;
		}

		// Clear screen to black and check that sceen is black
		gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
		gl.clear(GL_COLOR_BUFFER_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to clear surface");

		EGLU_CHECK_CALL(egl, swapBuffers(display, *surface));
		gl.finish();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glFinish() failed");
		deSleep(waitFrames * 16);
		window->processEvents();
		window->readScreenPixels(&blackFrame);

		if (!checkColor(m_testCtx.getLog(), blackFrame, tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f)))
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Couldn't reliably read pixels from screen");
			return;
		}

		gl.clearColor(0.7f, 1.0f, 0.3f, 1.0f);
		gl.clear(GL_COLOR_BUFFER_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to clear surface");

		gl.vertexAttribPointer(posLocation, 2, GL_FLOAT, GL_FALSE, 0, positions1);
		gl.drawArrays(GL_TRIANGLES, 0, 6);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to render");

		EGLU_CHECK_CALL(egl, swapBuffers(display, *surface));
		gl.finish();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glFinish() failed");
		deSleep(waitFrames * 16);
		window->processEvents();
		window->readScreenPixels(&frameBegin);

		gl.clearColor(0.7f, 0.7f, 1.0f, 1.0f);
		gl.clear(GL_COLOR_BUFFER_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to clear surface");

		gl.vertexAttribPointer(posLocation, 2, GL_FLOAT, GL_FALSE, 0, positions2);
		gl.drawArrays(GL_TRIANGLES, 0, 6);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to render");

		gl.finish();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glFinish() failed");
		deSleep(waitFrames * 16);
		window->readScreenPixels(&frameEnd);

		EGLU_CHECK_CALL(egl, swapBuffers(display, *surface));
		gl.finish();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glFinish() failed");
		deSleep(waitFrames * 16);
		window->processEvents();

		gl.disableVertexAttribArray(posLocation);
		gl.useProgram(0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to release program state");

		gl.deleteProgram(program);
		program = 0;
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteProgram()");

		if (!tcu::intThresholdCompare(m_testCtx.getLog(), "Compare end of frame against beginning of frame" , "Compare end of frame against beginning of frame", frameBegin.getAccess(), frameEnd.getAccess(), tcu::UVec4(0, 0, 0, 0), tcu::COMPARE_LOG_RESULT))
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Screen pixels changed during frame");
	}
	catch (...)
	{
		if (program != 0)
			gl.deleteProgram(program);

		EGLU_CHECK_CALL(egl, makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));
		throw;
	}

	EGLU_CHECK_CALL(egl, makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));
}